

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

void uv__signal_stop(uv_signal_t *handle)

{
  uint *puVar1;
  uint uVar2;
  uv_signal_s *puVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  uv__signal_tree_s uVar7;
  uv_signal_t *puVar8;
  uv_signal_s *puVar9;
  uv_signal_s *puVar10;
  uv_signal_s *puVar11;
  anon_struct_32_4_548b78d9_for_tree_entry *paVar12;
  uv_signal_s *old;
  uv__signal_tree_s uVar13;
  sigset_t saved_sigmask;
  sigset_t local_130;
  sigaction local_b0;
  
  if (handle->signum == 0) {
    return;
  }
  uv__signal_block_and_lock(&local_130);
  puVar10 = (handle->tree_entry).rbe_left;
  puVar11 = (handle->tree_entry).rbe_right;
  uVar7.rbh_root = puVar11;
  if ((puVar10 == (uv_signal_s *)0x0) || (uVar7.rbh_root = puVar10, puVar11 == (uv_signal_s *)0x0))
  {
    puVar10 = (handle->tree_entry).rbe_parent;
    iVar6 = (handle->tree_entry).rbe_color;
    if (uVar7.rbh_root != (uv_signal_s *)0x0) {
      ((uVar7.rbh_root)->tree_entry).rbe_parent = puVar10;
    }
    if (puVar10 == (uv_signal_s *)0x0) {
      puVar10 = (uv_signal_s *)0x0;
      uv__signal_tree.rbh_root = uVar7.rbh_root;
    }
    else if ((puVar10->tree_entry).rbe_left == handle) {
      (puVar10->tree_entry).rbe_left = uVar7.rbh_root;
    }
    else {
      (puVar10->tree_entry).rbe_right = uVar7.rbh_root;
    }
  }
  else {
    do {
      puVar9 = puVar11;
      puVar11 = (puVar9->tree_entry).rbe_left;
    } while (puVar11 != (uv_signal_s *)0x0);
    uVar7.rbh_root = (puVar9->tree_entry).rbe_right;
    puVar10 = (puVar9->tree_entry).rbe_parent;
    iVar6 = (puVar9->tree_entry).rbe_color;
    if (uVar7.rbh_root != (uv_signal_s *)0x0) {
      ((uVar7.rbh_root)->tree_entry).rbe_parent = puVar10;
    }
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
    if (puVar10 != (uv_signal_s *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar10->tree_entry).rbe_right;
      if ((puVar10->tree_entry).rbe_left == puVar9) {
        paVar12 = &puVar10->tree_entry;
      }
    }
    paVar12->rbe_left = uVar7.rbh_root;
    if ((puVar9->tree_entry).rbe_parent == handle) {
      puVar10 = puVar9;
    }
    puVar11 = (handle->tree_entry).rbe_left;
    puVar3 = (handle->tree_entry).rbe_right;
    iVar4 = (handle->tree_entry).rbe_color;
    uVar5 = *(undefined4 *)&(handle->tree_entry).field_0x1c;
    (puVar9->tree_entry).rbe_parent = (handle->tree_entry).rbe_parent;
    (puVar9->tree_entry).rbe_color = iVar4;
    *(undefined4 *)&(puVar9->tree_entry).field_0x1c = uVar5;
    (puVar9->tree_entry).rbe_left = puVar11;
    (puVar9->tree_entry).rbe_right = puVar3;
    puVar11 = (handle->tree_entry).rbe_parent;
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
    if (puVar11 != (uv_signal_s *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar11->tree_entry).rbe_right;
      if ((puVar11->tree_entry).rbe_left == handle) {
        paVar12 = &puVar11->tree_entry;
      }
    }
    paVar12->rbe_left = puVar9;
    (((handle->tree_entry).rbe_left)->tree_entry).rbe_parent = puVar9;
    puVar11 = (handle->tree_entry).rbe_right;
    if (puVar11 != (uv_signal_s *)0x0) {
      (puVar11->tree_entry).rbe_parent = puVar9;
    }
  }
  uVar13.rbh_root = uv__signal_tree.rbh_root;
  if (iVar6 == 0) {
    do {
      if (((uVar7.rbh_root != (uv_signal_s *)0x0) && (((uVar7.rbh_root)->tree_entry).rbe_color != 0)
          ) || (uVar7.rbh_root == uVar13.rbh_root)) goto LAB_00108bce;
      puVar11 = (puVar10->tree_entry).rbe_left;
      if (puVar11 == uVar7.rbh_root) {
        puVar11 = (puVar10->tree_entry).rbe_right;
        if ((puVar11->tree_entry).rbe_color == 1) {
          (puVar11->tree_entry).rbe_color = 0;
          (puVar10->tree_entry).rbe_color = 1;
          puVar9 = (puVar11->tree_entry).rbe_left;
          (puVar10->tree_entry).rbe_right = puVar9;
          if (puVar9 != (uv_signal_s *)0x0) {
            (puVar9->tree_entry).rbe_parent = puVar10;
          }
          puVar9 = (puVar10->tree_entry).rbe_parent;
          (puVar11->tree_entry).rbe_parent = puVar9;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          puVar3 = puVar11;
          if (puVar9 != (uv_signal_s *)0x0) {
            puVar9 = (puVar10->tree_entry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
            puVar3 = uVar13.rbh_root;
            if (puVar10 == (puVar9->tree_entry).rbe_left) {
              paVar12 = &puVar9->tree_entry;
            }
          }
          uVar13.rbh_root = puVar3;
          paVar12->rbe_left = puVar11;
          (puVar11->tree_entry).rbe_left = puVar10;
          (puVar10->tree_entry).rbe_parent = puVar11;
          puVar11 = (puVar10->tree_entry).rbe_right;
        }
        puVar9 = (puVar11->tree_entry).rbe_left;
        if (((puVar9 != (uv_signal_s *)0x0) && ((puVar9->tree_entry).rbe_color != 0)) ||
           ((puVar3 = (puVar11->tree_entry).rbe_right, puVar3 != (uv_signal_s *)0x0 &&
            ((puVar3->tree_entry).rbe_color != 0)))) {
          puVar3 = (puVar11->tree_entry).rbe_right;
          if ((puVar3 == (uv_signal_s *)0x0) || ((puVar3->tree_entry).rbe_color == 0)) {
            if (puVar9 != (uv_signal_s *)0x0) {
              (puVar9->tree_entry).rbe_color = 0;
            }
            (puVar11->tree_entry).rbe_color = 1;
            puVar3 = (puVar9->tree_entry).rbe_right;
            (puVar11->tree_entry).rbe_left = puVar3;
            if (puVar3 != (uv_signal_s *)0x0) {
              (puVar3->tree_entry).rbe_parent = puVar11;
            }
            puVar3 = (puVar11->tree_entry).rbe_parent;
            (puVar9->tree_entry).rbe_parent = puVar3;
            if (puVar3 == (uv_signal_s *)0x0) {
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
            }
            else {
              puVar3 = (puVar11->tree_entry).rbe_parent;
              paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar3->tree_entry).rbe_right;
              if (puVar11 == (puVar3->tree_entry).rbe_left) {
                paVar12 = &puVar3->tree_entry;
              }
            }
            paVar12->rbe_left = puVar9;
            (puVar9->tree_entry).rbe_right = puVar11;
            (puVar11->tree_entry).rbe_parent = puVar9;
            puVar11 = (puVar10->tree_entry).rbe_right;
          }
          (puVar11->tree_entry).rbe_color = (puVar10->tree_entry).rbe_color;
          (puVar10->tree_entry).rbe_color = 0;
          puVar11 = (puVar11->tree_entry).rbe_right;
          if (puVar11 != (uv_signal_s *)0x0) {
            (puVar11->tree_entry).rbe_color = 0;
          }
          puVar11 = (puVar10->tree_entry).rbe_right;
          puVar9 = (puVar11->tree_entry).rbe_left;
          (puVar10->tree_entry).rbe_right = puVar9;
          if (puVar9 != (uv_signal_s *)0x0) {
            (puVar9->tree_entry).rbe_parent = puVar10;
          }
          puVar9 = (puVar10->tree_entry).rbe_parent;
          (puVar11->tree_entry).rbe_parent = puVar9;
          if (puVar9 == (uv_signal_s *)0x0) {
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          }
          else {
            puVar9 = (puVar10->tree_entry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
            if (puVar10 == (puVar9->tree_entry).rbe_left) {
              paVar12 = &puVar9->tree_entry;
            }
          }
          paVar12->rbe_left = puVar11;
          (puVar11->tree_entry).rbe_left = puVar10;
          goto LAB_00108bc0;
        }
      }
      else {
        if ((puVar11->tree_entry).rbe_color == 1) {
          (puVar11->tree_entry).rbe_color = 0;
          (puVar10->tree_entry).rbe_color = 1;
          puVar9 = (puVar11->tree_entry).rbe_right;
          (puVar10->tree_entry).rbe_left = puVar9;
          if (puVar9 != (uv_signal_s *)0x0) {
            (puVar9->tree_entry).rbe_parent = puVar10;
          }
          puVar9 = (puVar10->tree_entry).rbe_parent;
          (puVar11->tree_entry).rbe_parent = puVar9;
          paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
          puVar3 = puVar11;
          if (puVar9 != (uv_signal_s *)0x0) {
            puVar9 = (puVar10->tree_entry).rbe_parent;
            paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
            puVar3 = uVar13.rbh_root;
            if (puVar10 == (puVar9->tree_entry).rbe_left) {
              paVar12 = &puVar9->tree_entry;
            }
          }
          uVar13.rbh_root = puVar3;
          paVar12->rbe_left = puVar11;
          (puVar11->tree_entry).rbe_right = puVar10;
          (puVar10->tree_entry).rbe_parent = puVar11;
          puVar11 = (puVar10->tree_entry).rbe_left;
        }
        puVar9 = (puVar11->tree_entry).rbe_left;
        if (((puVar9 != (uv_signal_s *)0x0) && ((puVar9->tree_entry).rbe_color != 0)) ||
           ((puVar3 = (puVar11->tree_entry).rbe_right, puVar3 != (uv_signal_s *)0x0 &&
            ((puVar3->tree_entry).rbe_color != 0)))) goto LAB_001089aa;
      }
      (puVar11->tree_entry).rbe_color = 1;
      uVar7.rbh_root = puVar10;
      puVar10 = (puVar10->tree_entry).rbe_parent;
    } while( true );
  }
LAB_00108bdd:
  iVar6 = handle->signum;
  puVar8 = uv__signal_first_handle(iVar6);
  if (puVar8 == (uv_signal_t *)0x0) {
    memset(&local_b0,0,0x98);
    iVar6 = sigaction(iVar6,&local_b0,(sigaction *)0x0);
    if (iVar6 != 0) {
      abort();
    }
  }
  else if ((((puVar8->flags & 0x2000000) != 0) && ((handle->flags & 0x2000000) == 0)) &&
          (iVar6 = uv__signal_register_handler(iVar6,1), iVar6 != 0)) {
    __assert_fail("ret == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                  ,0x225,"void uv__signal_stop(uv_signal_t *)");
  }
  uv__signal_unlock_and_unblock(&local_130);
  handle->signum = 0;
  uVar2 = handle->flags;
  if (((uVar2 & 4) != 0) && (handle->flags = uVar2 & 0xfffffffb, (uVar2 & 8) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  return;
LAB_001089aa:
  if ((puVar9 == (uv_signal_s *)0x0) || ((puVar9->tree_entry).rbe_color == 0)) {
    puVar9 = (puVar11->tree_entry).rbe_right;
    if (puVar9 != (uv_signal_s *)0x0) {
      (puVar9->tree_entry).rbe_color = 0;
    }
    (puVar11->tree_entry).rbe_color = 1;
    puVar3 = (puVar9->tree_entry).rbe_left;
    (puVar11->tree_entry).rbe_right = puVar3;
    if (puVar3 != (uv_signal_s *)0x0) {
      (puVar3->tree_entry).rbe_parent = puVar11;
    }
    puVar3 = (puVar11->tree_entry).rbe_parent;
    (puVar9->tree_entry).rbe_parent = puVar3;
    if (puVar3 == (uv_signal_s *)0x0) {
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
    }
    else {
      puVar3 = (puVar11->tree_entry).rbe_parent;
      paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar3->tree_entry).rbe_right;
      if (puVar11 == (puVar3->tree_entry).rbe_left) {
        paVar12 = &puVar3->tree_entry;
      }
    }
    paVar12->rbe_left = puVar9;
    (puVar9->tree_entry).rbe_left = puVar11;
    (puVar11->tree_entry).rbe_parent = puVar9;
    puVar11 = (puVar10->tree_entry).rbe_left;
  }
  (puVar11->tree_entry).rbe_color = (puVar10->tree_entry).rbe_color;
  (puVar10->tree_entry).rbe_color = 0;
  puVar11 = (puVar11->tree_entry).rbe_left;
  if (puVar11 != (uv_signal_s *)0x0) {
    (puVar11->tree_entry).rbe_color = 0;
  }
  puVar11 = (puVar10->tree_entry).rbe_left;
  puVar9 = (puVar11->tree_entry).rbe_right;
  (puVar10->tree_entry).rbe_left = puVar9;
  if (puVar9 != (uv_signal_s *)0x0) {
    (puVar9->tree_entry).rbe_parent = puVar10;
  }
  puVar9 = (puVar10->tree_entry).rbe_parent;
  (puVar11->tree_entry).rbe_parent = puVar9;
  if (puVar9 == (uv_signal_s *)0x0) {
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&uv__signal_tree;
  }
  else {
    puVar9 = (puVar10->tree_entry).rbe_parent;
    paVar12 = (anon_struct_32_4_548b78d9_for_tree_entry *)&(puVar9->tree_entry).rbe_right;
    if (puVar10 == (puVar9->tree_entry).rbe_left) {
      paVar12 = &puVar9->tree_entry;
    }
  }
  paVar12->rbe_left = puVar11;
  (puVar11->tree_entry).rbe_right = puVar10;
LAB_00108bc0:
  (puVar10->tree_entry).rbe_parent = puVar11;
  uVar7 = uv__signal_tree;
LAB_00108bce:
  if (uVar7.rbh_root != (uv_signal_s *)0x0) {
    ((uVar7.rbh_root)->tree_entry).rbe_color = 0;
  }
  goto LAB_00108bdd;
}

Assistant:

static void uv__signal_stop(uv_signal_t* handle) {
  uv_signal_t* removed_handle;
  sigset_t saved_sigmask;
  uv_signal_t* first_handle;
  int rem_oneshot;
  int first_oneshot;
  int ret;

  /* If the watcher wasn't started, this is a no-op. */
  if (handle->signum == 0)
    return;

  uv__signal_block_and_lock(&saved_sigmask);

  removed_handle = RB_REMOVE(uv__signal_tree_s, &uv__signal_tree, handle);
  assert(removed_handle == handle);
  (void) removed_handle;

  /* Check if there are other active signal watchers observing this signal. If
   * not, unregister the signal handler.
   */
  first_handle = uv__signal_first_handle(handle->signum);
  if (first_handle == NULL) {
    uv__signal_unregister_handler(handle->signum);
  } else {
    rem_oneshot = handle->flags & UV_SIGNAL_ONE_SHOT;
    first_oneshot = first_handle->flags & UV_SIGNAL_ONE_SHOT;
    if (first_oneshot && !rem_oneshot) {
      ret = uv__signal_register_handler(handle->signum, 1);
      assert(ret == 0);
      (void)ret;
    }
  }

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signum = 0;
  uv__handle_stop(handle);
}